

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret,
          vector<duckdb::Value,_true> *default_value)

{
  pointer pVVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *this_00;
  long lVar4;
  Value val;
  pointer local_98;
  pointer pVStack_90;
  pointer local_88;
  pointer local_78;
  pointer pVStack_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  
  this_00 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98;
  uVar2 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar2 == '\0') {
    local_68._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pVVar1 = (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_78 = (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
    pVStack_70 = (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_start;
    (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
    (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    this_00 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78;
    (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_98 = (pointer)0x0;
    pVStack_90 = (pointer)0x0;
    local_88 = (pointer)0x0;
    iVar3 = (*this->_vptr_Deserializer[8])(this);
    lVar4 = CONCAT44(extraout_var,iVar3);
    if (lVar4 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        Value::Deserialize((Value *)&local_78,this);
        (*this->_vptr_Deserializer[7])(this);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98,
                   (Value *)&local_78);
        Value::~Value((Value *)&local_78);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    local_68._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_88;
    local_78 = (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
    pVStack_70 = (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = local_98;
    (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVStack_90;
    local_98 = (pointer)0x0;
    pVStack_90 = (pointer)0x0;
    local_88 = (pointer)0x0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(this_00);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar2 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T &ret, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(default_value);
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}